

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ValueRangeExpressionSyntax::setChild
          (ValueRangeExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00aeb218 + *(int *)(&DAT_00aeb218 + in_RSI * 4)))();
  return;
}

Assistant:

void ValueRangeExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: op = child.token(); return;
        case 3: right = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: closeBracket = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}